

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

void __thiscall
TPZFMatrix<long_double>::GramSchmidt
          (TPZFMatrix<long_double> *this,TPZFMatrix<long_double> *Orthog,
          TPZFMatrix<long_double> *TransfToOrthog)

{
  longdouble *plVar1;
  int64_t j;
  long lVar2;
  long lVar3;
  int64_t c_1;
  long lVar4;
  int64_t i;
  long lVar5;
  int64_t c;
  long lVar6;
  long lVar7;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar8;
  longdouble lVar9;
  longdouble in_ST6;
  longdouble lVar10;
  longdouble in_ST7;
  double dVar11;
  longdouble local_98;
  longdouble local_8c;
  double local_80;
  
  local_80 = 1.0;
  for (lVar2 = 0; lVar2 < (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
      lVar2 = lVar2 + 1) {
    dVar11 = 0.0;
    for (lVar5 = 0; lVar5 < (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
        lVar5 = lVar5 + 1) {
      (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0x24])(this,lVar5,lVar2);
      (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0x24])(this,lVar5,lVar2);
      dVar11 = dVar11 + ABS((double)(in_ST0 * in_ST1));
      in_ST0 = in_ST2;
      in_ST1 = in_ST3;
      in_ST2 = in_ST4;
      in_ST3 = in_ST5;
      in_ST4 = in_ST6;
      in_ST5 = in_ST7;
      in_ST6 = in_ST7;
    }
    if (dVar11 < 0.0) {
      dVar11 = sqrt(dVar11);
    }
    else {
      dVar11 = SQRT(dVar11);
    }
    if ((1e-10 < dVar11) && (local_80 < 1.0 / dVar11)) {
      local_80 = 1.0 / dVar11;
    }
  }
  lVar9 = in_ST6;
  (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x26]
  )(this);
  lVar2 = (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
  lVar5 = (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
  (*(Orthog->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
    [0xd])(Orthog,lVar2,lVar5);
  (*(Orthog->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
    [0xf])(Orthog);
  lVar3 = 0;
  lVar4 = 0;
  if (0 < lVar5) {
    lVar4 = lVar5;
  }
  if (lVar2 < 1) {
    lVar2 = lVar3;
  }
  for (; lVar3 != lVar2; lVar3 = lVar3 + 1) {
    for (lVar6 = 0; lVar4 != lVar6; lVar6 = lVar6 + 1) {
      (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0x24])(this,lVar3,lVar6);
      plVar1 = operator()(Orthog,lVar3,lVar6);
      *plVar1 = in_ST0;
      in_ST0 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = in_ST5;
      in_ST5 = in_ST6;
      in_ST6 = lVar9;
    }
  }
  for (lVar3 = 1; lVar3 < lVar5; lVar3 = lVar3 + 1) {
    for (lVar6 = 0; lVar6 != lVar3; lVar6 = lVar6 + 1) {
      local_98 = (longdouble)0;
      local_8c = local_98;
      for (lVar7 = 0; lVar2 != lVar7; lVar7 = lVar7 + 1) {
        lVar8 = in_ST5;
        (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x24])(this,lVar7,lVar3);
        plVar1 = operator()(Orthog,lVar7,lVar6);
        local_8c = local_8c + in_ST0 * *plVar1;
        plVar1 = operator()(Orthog,lVar7,lVar6);
        lVar9 = *plVar1;
        plVar1 = operator()(Orthog,lVar7,lVar6);
        local_98 = local_98 + lVar9 * *plVar1;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = lVar8;
      }
      if ((longdouble)1e-08 <= ABS(local_98)) {
        for (lVar7 = 0; lVar2 != lVar7; lVar7 = lVar7 + 1) {
          plVar1 = operator()(Orthog,lVar7,lVar6);
          lVar9 = *plVar1;
          plVar1 = operator()(Orthog,lVar7,lVar3);
          *plVar1 = *plVar1 - (local_8c * lVar9) / local_98;
        }
      }
      else {
        for (lVar7 = 0; lVar2 != lVar7; lVar7 = lVar7 + 1) {
          plVar1 = operator()(Orthog,lVar7,lVar6);
          *plVar1 = (longdouble)0;
        }
      }
    }
  }
  for (lVar5 = 0; lVar5 != lVar4; lVar5 = lVar5 + 1) {
    local_98 = (longdouble)0;
    for (lVar3 = 0; lVar2 != lVar3; lVar3 = lVar3 + 1) {
      plVar1 = operator()(Orthog,lVar3,lVar5);
      lVar9 = *plVar1;
      plVar1 = operator()(Orthog,lVar3,lVar5);
      local_98 = local_98 + lVar9 * *plVar1;
    }
    if (ABS(local_98) <= (longdouble)1e-08) {
      for (lVar3 = 0; lVar2 != lVar3; lVar3 = lVar3 + 1) {
        plVar1 = operator()(Orthog,lVar3,lVar5);
        *plVar1 = (longdouble)0;
      }
    }
    else {
      lVar9 = in_ST5;
      for (lVar3 = 0; lVar2 != lVar3; lVar3 = lVar3 + 1) {
        plVar1 = operator()(Orthog,lVar3,lVar5);
        lVar8 = *plVar1;
        sqrtl();
        lVar10 = lVar9;
        plVar1 = operator()(Orthog,lVar3,lVar5);
        *plVar1 = lVar8 / in_ST0;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = lVar9;
        lVar9 = lVar10;
      }
    }
  }
  (*(Orthog->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
    [0x25])(Orthog,this,TransfToOrthog,1);
  (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x26]
  )(this);
  (*(TransfToOrthog->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable[0x26])(TransfToOrthog);
  return;
}

Assistant:

void TPZFMatrix<TVar>::GramSchmidt(TPZFMatrix<TVar> &Orthog, TPZFMatrix<TVar> &TransfToOrthog)
{
    if constexpr (std::is_same<TVar, TFad<6, REAL>>::value ||
                  std::is_same<TVar, Fad<float>>::value ||
                  std::is_same<TVar, Fad<double>>::value ||
                  std::is_same<TVar, Fad<long double>>::value||
                  std::is_same<TVar,int>::value||
                  std::is_same<TVar,TPZFlopCounter>::value) {
        PZError<<__PRETTY_FUNCTION__;
        PZError<<" not implemented for this type\n";
        PZError<<"Aborting...";
        DebugStop();
    }
#ifdef PZ_LOG2
    if (logger.isDebugEnabled())
    {
        std::stringstream sout;
        Print("GrSchmidt Entrada",sout);
        LOGPZ_DEBUG(logger,sout.str())
    }
#endif
    
    double scale = 1.;
    for(int64_t j = 0; j < this->Cols(); j++)
    {
        double norm = 0.;
        for(int64_t i = 0; i < this->Rows(); i++)
        {
            norm += fabs(TPZExtractVal::val(this->GetVal(i,j)*this->GetVal(i,j)));
        }
        norm = sqrt(norm);
        if(norm > 1.e-10)
        {
            if((1.)/norm > scale) scale = (1.)/norm;
        }
    }
    
    this->operator *=( scale );
    
    int64_t QTDcomp = this->Rows();
    int64_t QTDvec = this->Cols();
    Orthog.Resize(QTDcomp,QTDvec);
    Orthog.Zero();
    /// Making a copy of *this (Ortog = *this)
    for(int64_t r = 0; r < QTDcomp; r++)
    {
        for(int64_t c = 0; c < QTDvec; c++)
        {
            Orthog(r,c) = GetVal(r,c);
        }
    }
    
#ifdef PZDEBUG
    int check = 0;
    for(int64_t c = 0; c < QTDvec; c++)
    {
        TVar summ = 0.;
        for(int64_t r = 0; r < QTDcomp; r++)
        {
            summ += fabs(GetVal(r,c));
        }
        if(fabs(summ) < 0.00001)
        {
            std::stringstream sout;
            sout << "Null Vector on Gram-Schmidt Method! Col = " << c << "\n";
            LOGPZ_ERROR(logger,sout.str())
            check = 1;
        }
    }
#endif
    
    TVar dotUp, dotDown;
    for(int64_t c = 1; c < QTDvec; c++)
    {
        for(int64_t stop = 0; stop < c; stop++)
        {
            dotUp = 0.;
            dotDown = 0.;
            for(int64_t r = 0; r < QTDcomp; r++)
            {
                dotUp += GetVal(r,c)*Orthog(r,stop);
                dotDown += Orthog(r,stop)*Orthog(r,stop);
            }
            if(fabs(dotDown) < 1.E-8)
            {
#ifdef PZDEBUG
                if(check == 0)
                {
                    std::stringstream sout;
                    sout << "Parallel Vectors on Gram-Schmidt Method! Col = " << stop << "\n";
                    LOGPZ_ERROR(logger,sout.str())
                }
#endif
                
                for(int64_t r = 0; r < QTDcomp; r++)
                {
                    Orthog(r,stop) = 0.;
                }
            }
            else
            {
#ifdef PZ_LOG2
                if (logger.isDebugEnabled())
                {
                    std::stringstream sout;
                    sout << "dotdown = " << dotDown << " dotup = " << dotUp;
                    LOGPZ_DEBUG(logger,sout.str())
                }
#endif
                
                for(int64_t r = 0; r < QTDcomp; r++)
                {
                    Orthog(r,c) -= dotUp*Orthog(r,stop)/dotDown;
                }
            }
        }
    }
    for(int64_t c = 0; c < QTDvec; c++)
    {
        dotUp = 0.;
        for(int64_t r = 0; r < QTDcomp; r++)
        {
            dotUp += Orthog(r,c)*Orthog(r,c);
        }
        if(fabs(dotUp) > 1.e-8)
        {
            for(int64_t r = 0; r < QTDcomp; r++)
            {
                Orthog(r,c) = Orthog(r,c)/sqrt(dotUp);
            }
        }
        else {
#ifdef PZ_LOG
            std::stringstream sout;
            sout << "Linearly dependent columns dotUp = " << dotUp;
            LOGPZ_ERROR(logger,sout.str())
#endif
            
            for(int64_t r = 0; r < QTDcomp; r++)
            {
                Orthog(r,c) = 0.;
            }
        }
        
    }
    Orthog.Multiply(*this,TransfToOrthog,1);
    
    this->operator*= ( 1./scale );
    TransfToOrthog.operator*= ( 1./scale );
    
#ifdef PZ_LOG2
    if (logger.isDebugEnabled())
    {
        std::stringstream sout;
        sout << endl;
        sout << "Output GS" << endl;
        Orthog.Print("Orthog matrix",sout);
        TransfToOrthog.Print("TransfToOrthog matrix",sout);
        LOGPZ_DEBUG(logger,sout.str())
    }
#endif
    
#ifdef PZDEBUG
    TPZFNMatrix<9, TVar> OrthogT;
    Orthog.Transpose(&OrthogT);
    TPZAxesTools<TVar>::VerifyAxes(OrthogT);
#endif
}